

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O2

Result tonk::SecureRandom_Initialize(void)

{
  int iVar1;
  char *pcVar2;
  ErrorResult *in_RDI;
  allocator local_41;
  Locker locker;
  string local_38 [32];
  
  locker.TheLock = (Lock *)PrngLock;
  std::recursive_mutex::lock((recursive_mutex *)PrngLock);
  if (PrngInitialized == '\x01') {
LAB_001595f4:
    in_RDI->Source = (char *)0x0;
  }
  else {
    iVar1 = cymric_init_(4);
    if (iVar1 == 0) {
      iVar1 = cymric_seed((cymric_rng *)Prng,(void *)0x0,0);
      if (iVar1 == 0) {
        PrngInitialized = '\x01';
        goto LAB_001595f4;
      }
      std::__cxx11::string::string(local_38,"cymric_seed failed",&local_41);
      pcVar2 = (char *)operator_new(0x38);
      *(char **)pcVar2 = "SecureRandom_Initialize";
      std::__cxx11::string::string((string *)(pcVar2 + 8),local_38);
    }
    else {
      std::__cxx11::string::string(local_38,"cymric_init failed",&local_41);
      pcVar2 = (char *)operator_new(0x38);
      *(char **)pcVar2 = "tonk_init";
      std::__cxx11::string::string((string *)(pcVar2 + 8),local_38);
    }
    pcVar2[0x28] = '\x03';
    pcVar2[0x29] = '\0';
    pcVar2[0x2a] = '\0';
    pcVar2[0x2b] = '\0';
    in_RDI->Source = pcVar2;
    *(long *)(pcVar2 + 0x30) = (long)iVar1;
    std::__cxx11::string::~string(local_38);
  }
  Locker::~Locker(&locker);
  return (Result)in_RDI;
}

Assistant:

Result SecureRandom_Initialize()
{
    Locker locker(PrngLock);
    if (PrngInitialized)
        return Result::Success();

    int cymricResult = cymric_init();
    if (0 != cymricResult)
    {
        TONK_DEBUG_BREAK(); // Should never happen
        return Result("tonk_init", "cymric_init failed", ErrorType::Cymric, cymricResult);
    }

    cymricResult = cymric_seed(&Prng, nullptr, 0);
    if (0 != cymricResult)
    {
        TONK_DEBUG_BREAK(); // Should never happen
        return Result("SecureRandom_Initialize", "cymric_seed failed", ErrorType::Cymric, cymricResult);
    }

    PrngInitialized = true;
    return Result::Success();
}